

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O2

void __thiscall chrono::ChForce::ChForce(ChForce *this,ChForce *other)

{
  ReferenceFrame RVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChObj::ChObj(&this->super_ChObj,&other->super_ChObj);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChForce_0114f730;
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->restpos).m_data[0] = 0.0;
  (this->restpos).m_data[1] = 0.0;
  (this->restpos).m_data[2] = 0.0;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->vpoint).m_data[0] = 0.0;
  (this->vpoint).m_data[1] = 0.0;
  (this->vpoint).m_data[2] = 0.0;
  (this->vrelpoint).m_data[0] = 0.0;
  (this->vrelpoint).m_data[1] = 0.0;
  (this->vrelpoint).m_data[2] = 0.0;
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->restpos).m_data[1] = 0.0;
  (this->restpos).m_data[2] = 0.0;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->vdir).m_data[0] = 0.0;
  (this->vdir).m_data[1] = 0.0;
  (this->vdir).m_data[2] = 0.0;
  (this->vreldir).m_data[0] = 0.0;
  (this->vreldir).m_data[1] = 0.0;
  (this->vreldir).m_data[2] = 0.0;
  (this->vreldir).m_data[1] = 0.0;
  (this->vreldir).m_data[2] = 0.0;
  (this->force).m_data[0] = 0.0;
  (this->force).m_data[1] = 0.0;
  (this->force).m_data[2] = 0.0;
  (this->relforce).m_data[0] = 0.0;
  (this->relforce).m_data[1] = 0.0;
  (this->relforce).m_data[2] = 0.0;
  this->Body = other->Body;
  this->mforce = other->mforce;
  if (other != this) {
    (this->force).m_data[0] = (other->force).m_data[0];
    (this->force).m_data[1] = (other->force).m_data[1];
    (this->force).m_data[2] = (other->force).m_data[2];
    (this->relforce).m_data[0] = (other->relforce).m_data[0];
    (this->relforce).m_data[1] = (other->relforce).m_data[1];
    (this->relforce).m_data[2] = (other->relforce).m_data[2];
    (this->vdir).m_data[0] = (other->vdir).m_data[0];
    (this->vdir).m_data[1] = (other->vdir).m_data[1];
    (this->vdir).m_data[2] = (other->vdir).m_data[2];
    (this->vreldir).m_data[0] = (other->vreldir).m_data[0];
    (this->vreldir).m_data[1] = (other->vreldir).m_data[1];
    (this->vreldir).m_data[2] = (other->vreldir).m_data[2];
    (this->vpoint).m_data[0] = (other->vpoint).m_data[0];
    (this->vpoint).m_data[1] = (other->vpoint).m_data[1];
    (this->vpoint).m_data[2] = (other->vpoint).m_data[2];
    (this->vrelpoint).m_data[0] = (other->vrelpoint).m_data[0];
    (this->vrelpoint).m_data[1] = (other->vrelpoint).m_data[1];
    (this->vrelpoint).m_data[2] = (other->vrelpoint).m_data[2];
    (this->restpos).m_data[0] = (other->restpos).m_data[0];
    (this->restpos).m_data[1] = (other->restpos).m_data[1];
    (this->restpos).m_data[2] = (other->restpos).m_data[2];
  }
  this->align = other->align;
  RVar1 = other->frame;
  this->mode = other->mode;
  this->frame = RVar1;
  (this->super_ChObj).ChTime = (other->super_ChObj).ChTime;
  Eigen::internal::call_assignment<Eigen::Matrix<double,7,1,0,7,1>,Eigen::Matrix<double,7,1,0,7,1>>
            (&this->Qf,&other->Qf);
  iVar2 = (*((other->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar2 = (*((other->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_00,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar2 = (*((other->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_01,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar2 = (*((other->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_02,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar2 = (*((other->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_03,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar2 = (*((other->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_04,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar2 = (*((other->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_05,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChForce::ChForce(const ChForce& other) : ChObj(other) {
    Body = other.Body;

    mforce = other.mforce;
    force = other.force;
    relforce = other.relforce;
    vdir = other.vdir;
    vreldir = other.vreldir;
    vpoint = other.vpoint;
    vrelpoint = other.vrelpoint;
    restpos = other.restpos;
    align = other.align;
    frame = other.frame;
    mode = other.mode;

    ChTime = other.ChTime;

    Qf = other.Qf;

    modula = std::shared_ptr<ChFunction>(other.modula->Clone());

    move_x = std::shared_ptr<ChFunction>(other.move_x->Clone());
    move_y = std::shared_ptr<ChFunction>(other.move_y->Clone());
    move_z = std::shared_ptr<ChFunction>(other.move_z->Clone());

    f_x = std::shared_ptr<ChFunction>(other.f_x->Clone());
    f_y = std::shared_ptr<ChFunction>(other.f_y->Clone());
    f_z = std::shared_ptr<ChFunction>(other.f_z->Clone());
}